

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

void VP8Clear(VP8Decoder *dec)

{
  WebPWorkerInterface *pWVar1;
  long in_RDI;
  
  if (in_RDI != 0) {
    pWVar1 = WebPGetWorkerInterface();
    (*pWVar1->End)((WebPWorker *)(in_RDI + 0x98));
    WebPDeallocateAlphaMemory((VP8Decoder *)0x106f8d);
    WebPSafeFree((void *)0x106f9d);
    *(undefined8 *)(in_RDI + 0xb48) = 0;
    *(undefined8 *)(in_RDI + 0xb50) = 0;
    memset((void *)(in_RDI + 0x10),0,0x30);
    *(undefined4 *)(in_RDI + 4) = 0;
  }
  return;
}

Assistant:

void VP8Clear(VP8Decoder* const dec) {
  if (dec == NULL) {
    return;
  }
  WebPGetWorkerInterface()->End(&dec->worker_);
  WebPDeallocateAlphaMemory(dec);
  WebPSafeFree(dec->mem_);
  dec->mem_ = NULL;
  dec->mem_size_ = 0;
  memset(&dec->br_, 0, sizeof(dec->br_));
  dec->ready_ = 0;
}